

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool AdjustCurve(ON_Curve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_3dVector axis;
  ON_3dPoint center;
  bool bVar5;
  int iVar6;
  uint c;
  int iVar7;
  ON_LineCurve *pOVar8;
  ON_CurveProxy *pOVar9;
  ON_NurbsCurve *this;
  ON_PolyCurve *this_00;
  _func_int **pp_Var10;
  ON_3dPoint *point;
  ON_Curve *pOVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  double local_1b0;
  ON_3dPoint local_198;
  ON_3dPoint local_178;
  ON_Xform local_160;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  bVar13 = 0;
  do {
    pOVar8 = ON_LineCurve::Cast((ON_Object *)crv);
    if (pOVar8 != (ON_LineCurve *)0x0) {
      (*(pOVar8->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])(pOVar8);
      pp_Var10 = (pOVar8->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
LAB_004260f4:
      (*pp_Var10[0x3a])(pOVar8);
      bVar13 = 1;
      goto LAB_00426919;
    }
    pOVar9 = ON_CurveProxy::Cast((ON_Object *)crv);
    if (pOVar9 != (ON_CurveProxy *)0x0) {
LAB_004260a6:
      bVar13 = 0;
      goto LAB_00426919;
    }
    iVar6 = (*((ON_Object *)crv)->_vptr_ON_Object[0x34])(crv);
    if ((char)iVar6 != '\0') {
      bVar5 = ON_3dPoint::operator!=(P0,P1);
      if (bVar5) goto LAB_004260a6;
      ON_Curve::PointAtStart(&local_198,crv);
      ON_3dPoint::operator-((ON_3dVector *)&local_178,P0,&local_198);
      dVar2 = ON_3dVector::Length((ON_3dVector *)&local_178);
      bVar13 = 1.490116119385e-08 < dVar2;
      if (1.490116119385e-08 < dVar2) {
        ON_Xform::TranslationTransformation(&local_160,(ON_3dVector *)&local_178);
        (*((ON_Object *)crv)->_vptr_ON_Object[0x1c])(crv,&local_160);
      }
      goto LAB_00426919;
    }
    pOVar8 = (ON_LineCurve *)ON_PolylineCurve::Cast((ON_Object *)crv);
    if (pOVar8 != (ON_LineCurve *)0x0) {
      AdjustPointListAlongChord((ON_3dPointArray *)&pOVar8->m_line,P0,P1);
      (*(pOVar8->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])(pOVar8);
      pp_Var10 = (pOVar8->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object;
      goto LAB_004260f4;
    }
    this = ON_NurbsCurve::Cast((ON_Object *)crv);
    if (this != (ON_NurbsCurve *)0x0) {
      iVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                        (this);
      bVar13 = 1;
      if (iVar6 < 4) {
        ON_NurbsCurve::ClampEnd(this,2);
        c = ON_NurbsCurve::CVCount(this);
        ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_160,c);
        uVar15 = (ulong)c;
        iVar6 = 0;
        if ((int)c < 1) {
          uVar15 = 0;
          iVar6 = 0;
        }
        for (; (int)uVar15 != iVar6; iVar6 = iVar6 + 1) {
          point = ON_SimpleArray<ON_3dPoint>::AppendNew((ON_SimpleArray<ON_3dPoint> *)&local_160);
          ON_NurbsCurve::GetCV(this,iVar6,point);
        }
        bVar5 = AdjustPointListAlongChord((ON_3dPointArray *)&local_160,P0,P1);
        bVar13 = 1;
        if (bVar5) {
          bVar5 = ON_NurbsCurve::IsRational(this);
          iVar6 = 0;
          for (lVar14 = 0; uVar15 * 0x18 - lVar14 != 0; lVar14 = lVar14 + 0x18) {
            local_1b0 = 1.0;
            if (bVar5) {
              local_1b0 = ON_NurbsCurve::Weight(this,iVar6);
              ON_3dPoint::operator*=
                        ((ON_3dPoint *)((long)(double *)local_160.m_xform[0][1] + lVar14),local_1b0)
              ;
            }
            ON_NurbsCurve::SetCV
                      (this,iVar6,(ON_3dPoint *)((long)(double *)local_160.m_xform[0][1] + lVar14));
            if (bVar5) {
              ON_NurbsCurve::SetWeight(this,iVar6,local_1b0);
            }
            iVar6 = iVar6 + 1;
          }
        }
        else {
          (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])(this);
          (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])(this);
        }
LAB_0042690c:
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&local_160);
      }
      goto LAB_00426919;
    }
    this_00 = ON_PolyCurve::Cast((ON_Object *)crv);
    if (this_00 == (ON_PolyCurve *)0x0) {
      ON_Curve::PointAtStart(&local_198,crv);
      ON_Curve::PointAtEnd(&local_178,crv);
      dVar2 = ON_3dPoint::DistanceTo(&local_198,P0);
      if ((1.490116119385e-08 <= dVar2) ||
         (dVar2 = ON_3dPoint::DistanceTo(&local_178,P1), 1.490116119385e-08 <= dVar2)) {
        dVar2 = ON_3dPoint::DistanceTo(&local_198,&local_178);
        dVar3 = ON_3dPoint::DistanceTo(P0,P1);
        if ((dVar2 * 0.1 <= dVar3) && (dVar3 * 0.1 <= dVar2)) {
          ON_3dPoint::operator+((ON_3dPoint *)&local_160,&local_198,&local_178);
          operator*(&local_c8,0.5,(ON_3dPoint *)&local_160);
          ON_3dPoint::operator+((ON_3dPoint *)&local_160,P0,P1);
          operator*(&local_48,0.5,(ON_3dPoint *)&local_160);
          ON_3dPoint::operator-(&local_60,&local_48,&local_c8);
          dVar4 = ON_3dVector::Length(&local_60);
          if (1.490116119385e-08 < dVar4) {
            ON_Xform::TranslationTransformation(&local_160,&local_60);
            (*((ON_Object *)crv)->_vptr_ON_Object[0x1c])(crv,&local_160);
          }
          ON_Curve::PointAtStart((ON_3dPoint *)&local_160,crv);
          local_198.z = local_160.m_xform[0][2];
          local_198.x = local_160.m_xform[0][0];
          local_198.y = local_160.m_xform[0][1];
          ON_Curve::PointAtEnd((ON_3dPoint *)&local_160,crv);
          local_178.z = local_160.m_xform[0][2];
          local_178.x = local_160.m_xform[0][0];
          local_178.y = local_160.m_xform[0][1];
          dVar4 = ON_3dPoint::DistanceTo(&local_198,P0);
          if ((1.490116119385e-08 <= dVar4) ||
             (dVar4 = ON_3dPoint::DistanceTo(&local_178,P1), 1.490116119385e-08 <= dVar4)) {
            if (1.490116119385e-08 < ABS(dVar3 - dVar2)) {
              ON_3dPoint::operator+(&local_e0,&local_198,&local_178);
              operator*((ON_3dPoint *)&local_160,0.5,&local_e0);
              local_c8.z = local_160.m_xform[0][2];
              local_c8.x = local_160.m_xform[0][0];
              local_c8.y = local_160.m_xform[0][1];
              ON_Xform::ScaleTransformation(&local_160,&local_c8,dVar3 / dVar2);
              (*((ON_Object *)crv)->_vptr_ON_Object[0x1c])(crv,&local_160);
            }
            ON_Curve::PointAtStart((ON_3dPoint *)&local_160,crv);
            local_198.z = local_160.m_xform[0][2];
            local_198.x = local_160.m_xform[0][0];
            local_198.y = local_160.m_xform[0][1];
            ON_Curve::PointAtEnd((ON_3dPoint *)&local_160,crv);
            local_178.z = local_160.m_xform[0][2];
            local_178.x = local_160.m_xform[0][0];
            local_178.y = local_160.m_xform[0][1];
            dVar2 = ON_3dPoint::DistanceTo(&local_198,P0);
            if (((1.490116119385e-08 <= dVar2) ||
                (dVar2 = ON_3dPoint::DistanceTo(&local_178,P1), 1.490116119385e-08 <= dVar2)) &&
               (1.490116119385e-08 <= dVar3)) {
              ON_3dPoint::operator+((ON_3dPoint *)&local_160,&local_48,&local_c8);
              operator*(&local_e0,0.5,(ON_3dPoint *)&local_160);
              ON_3dPoint::operator-(&local_78,&local_198,&local_e0);
              ON_3dVector::Unitize(&local_78);
              ON_3dPoint::operator-(&local_90,P0,&local_e0);
              ON_3dVector::Unitize(&local_90);
              ON_CrossProduct(&local_a8,&local_78,&local_90);
              dVar2 = ON_3dVector::Length(&local_a8);
              if (1.490116119385e-08 <= dVar2) {
                ON_3dVector::Unitize(&local_a8);
                dVar3 = ON_3dVector::operator*(&local_78,&local_90);
                ON_Xform::ON_Xform(&local_160);
                axis.y._0_4_ = SUB84(local_a8.y,0);
                axis.x = local_a8.x;
                axis.y._4_4_ = (int)((ulong)local_a8.y >> 0x20);
                axis.z = local_a8.z;
                center.y = local_e0.y;
                center.x = local_e0.x;
                center.z = local_e0.z;
                ON_Xform::Rotation(&local_160,dVar2,dVar3,axis,center);
                (*((ON_Object *)crv)->_vptr_ON_Object[0x1c])(crv,&local_160);
              }
            }
          }
        }
      }
      iVar6 = (*((ON_Object *)crv)->_vptr_ON_Object[0x39])(crv);
      bVar13 = 1;
      if ((char)iVar6 == '\0') {
        iVar6 = (*((ON_Object *)crv)->_vptr_ON_Object[0x3a])(crv);
        bVar13 = (byte)iVar6;
      }
      goto LAB_00426919;
    }
    iVar6 = ON_PolyCurve::Count(this_00);
    if (iVar6 != 1) {
      iVar6 = ON_PolyCurve::Count(this_00);
      ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_160,iVar6 + 1);
      ON_Curve::PointAtStart(&local_198,&this_00->super_ON_Curve);
      ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)&local_160,&local_198);
      for (iVar6 = 0; iVar7 = ON_PolyCurve::Count(this_00), iVar6 < iVar7; iVar6 = iVar6 + 1) {
        pOVar11 = ON_PolyCurve::SegmentCurve(this_00,iVar6);
        ON_Curve::PointAtEnd(&local_198,pOVar11);
        ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)&local_160,&local_198);
      }
      bVar5 = AdjustPointListAlongChord((ON_3dPointArray *)&local_160,P0,P1);
      if (bVar5) {
        lVar14 = 0x18;
        lVar12 = 0;
        bVar13 = 0;
        while ((iVar6 = ON_PolyCurve::Count(this_00), lVar12 < iVar6 &&
               (pOVar11 = ON_PolyCurve::SegmentCurve(this_00,(int)lVar12),
               pOVar11 != (ON_Curve *)0x0))) {
          bVar5 = AdjustCurve(pOVar11,(ON_3dPoint *)
                                      ((long)&((ON_3dPoint *)((long)local_160.m_xform[0][1] + -0x18)
                                              )->x + lVar14),
                              (ON_3dPoint *)((long)(double *)local_160.m_xform[0][1] + lVar14));
          ON_Curve::PointAtEnd(&local_198,pOVar11);
          if (bVar5) {
            bVar13 = 1;
          }
          *(double *)((long)((long)local_160.m_xform[0][1] + 0x10) + lVar14) = local_198.z;
          puVar1 = (undefined8 *)((long)(double *)local_160.m_xform[0][1] + lVar14);
          *puVar1 = local_198.x;
          puVar1[1] = local_198.y;
          lVar14 = lVar14 + 0x18;
          lVar12 = lVar12 + 1;
        }
      }
      else {
        iVar6 = (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])
                          (this_00);
        bVar13 = 1;
        if ((char)iVar6 == '\0') {
          iVar6 = (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                    [0x3a])(this_00);
          bVar13 = (byte)iVar6;
        }
      }
      goto LAB_0042690c;
    }
    crv = ON_PolyCurve::SegmentCurve(this_00,0);
    if ((ON_Object *)crv == (ON_Object *)0x0) {
LAB_00426919:
      return (bool)(bVar13 & 1);
    }
  } while( true );
}

Assistant:

static bool AdjustCurve(ON_Curve& crv, 
                        const ON_3dPoint& P0,
                        const ON_3dPoint& P1)

{
  ON_LineCurve* lc = ON_LineCurve::Cast(&crv);
  if (lc){
    lc->SetStartPoint(P0);
    lc->SetEndPoint(P1);
    return true;
  }

  ON_CurveProxy* pc = ON_CurveProxy::Cast(&crv);
  if (pc)
    return false;

  if (crv.IsClosed()){
    if (P0 != P1)
      return false;
    ON_3dPoint P = crv.PointAtStart();
    ON_3dVector TVec = P0-P;
    if (TVec.Length() > ON_SQRT_EPSILON){
      ON_Xform T(ON_Xform::TranslationTransformation(TVec));
      crv.Transform(T);
    }
    else
      return false;
    return true;
  }

  ON_PolylineCurve* plc = ON_PolylineCurve::Cast(&crv);
  if (plc) {
    AdjustPolylineCurve(*plc, P0, P1);
    return true;
  }

  ON_NurbsCurve* nc = ON_NurbsCurve::Cast(&crv);
  if (nc){
    AdjustNurbsCurve(*nc, P0, P1);
    return true;
  }

  ON_PolyCurve* plyc = ON_PolyCurve::Cast(&crv);
  if (plyc){
    return AdjustPolyCurve(*plyc, P0, P1);
  }

  ON_3dPoint A0 = crv.PointAtStart();
  ON_3dPoint A1 = crv.PointAtEnd();

  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  double alen = A0.DistanceTo(A1);
  double plen = P0.DistanceTo(P1);
  if (alen < 0.1*plen || plen < 0.1*alen){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  ON_3dPoint Ac = 0.5*(A0+A1);
  ON_3dPoint Pc = 0.5*(P0+P1);
  ON_3dVector TVec = Pc-Ac;
  if (TVec.Length() > ON_SQRT_EPSILON){
    const ON_Xform T(ON_Xform::TranslationTransformation(TVec));
    crv.Transform(T);
  }

  A0 = crv.PointAtStart();
  A1 = crv.PointAtEnd();
  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  if (fabs(plen - alen) > ON_SQRT_EPSILON){
    double scale = plen/alen;
    Ac = 0.5*(A0+A1);
    ON_Xform T(ON_Xform::ScaleTransformation(Ac, scale));
    crv.Transform(T);
  }

  A0 = crv.PointAtStart();
  A1 = crv.PointAtEnd();
  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  if (plen < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  ON_3dPoint C = 0.5*(Pc+Ac);
  ON_3dVector VA = A0-C;
  VA.Unitize();
  ON_3dVector VP = P0-C;
  VP.Unitize();

  ON_3dVector Axis = ON_CrossProduct(VA, VP);
  double sina = Axis.Length();
  if (sina < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }
  Axis.Unitize();
  double cosa = VA*VP;

  ON_Xform T;
  T.Rotation(sina, cosa, Axis, C);
  crv.Transform(T);
  return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
}